

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

void __thiscall
cfd::core::ScriptOperator::ScriptOperator(ScriptOperator *this,ScriptType data_type,string *text)

{
  string *__k;
  ScriptType SVar1;
  pointer pcVar2;
  iterator iVar3;
  long lVar4;
  long lVar5;
  string local_40;
  
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00686ad0;
  this->data_type_ = data_type;
  __k = &this->text_data_;
  (this->text_data_)._M_dataplus._M_p = (pointer)&(this->text_data_).field_2;
  pcVar2 = (text->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>((string *)__k,pcVar2,pcVar2 + text->_M_string_length);
  if (text->_M_string_length == 0) {
    if (g_operator_map._40_8_ == 0) {
      return;
    }
    ToString_abi_cxx11_(&local_40,this);
    ::std::__cxx11::string::operator=((string *)__k,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
    operator_delete(local_40._M_dataplus._M_p);
    return;
  }
  if (g_operator_map._16_8_ != 0) {
    SVar1 = this->data_type_;
    lVar4 = 0x6b9198;
    lVar5 = g_operator_map._16_8_;
    do {
      if ((int)SVar1 <= *(int *)(lVar5 + 0x20)) {
        lVar4 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < (int)SVar1) * 8);
    } while (lVar5 != 0);
    if ((lVar4 != 0x6b9198) && (*(int *)(lVar4 + 0x20) <= (int)SVar1)) goto LAB_00400e5b;
  }
  ::std::
  _Rb_tree<cfd::core::ScriptType,std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
  ::_M_emplace_unique<cfd::core::ScriptType&,cfd::core::ScriptOperator&>
            ((_Rb_tree<cfd::core::ScriptType,std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
              *)g_operator_map,&this->data_type_,this);
LAB_00400e5b:
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                  *)g_operator_text_map_abi_cxx11_,__k);
  if (iVar3._M_node == (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8)) {
    ::std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
    ::_M_emplace_unique<std::__cxx11::string&,cfd::core::ScriptOperator&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
                *)g_operator_text_map_abi_cxx11_,__k,this);
  }
  return;
}

Assistant:

ScriptOperator::ScriptOperator(ScriptType data_type, const std::string& text)
    : data_type_(data_type), text_data_(text) {
  // map register the const definition at production timing
  if (text.empty()) {
    if (!g_operator_map.empty()) {
      text_data_ = ToString();
    }
  } else {
    if (g_operator_map.find(data_type_) == g_operator_map.end()) {
      g_operator_map.emplace(data_type_, *this);
    }
    if (g_operator_text_map.find(text_data_) == g_operator_text_map.end()) {
      g_operator_text_map.emplace(text_data_, *this);
    }
  }
}